

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.hpp
# Opt level: O0

void __thiscall
qclab::qgates::Phase<std::complex<double>_>::Phase
          (Phase<std::complex<double>_> *this,int qubit,real_type theta,bool fixed)

{
  bool fixed_local;
  real_type theta_local;
  int qubit_local;
  Phase<std::complex<double>_> *this_local;
  
  QGate1<std::complex<double>_>::QGate1(&this->super_QGate1<std::complex<double>_>,qubit);
  QAdjustable::QAdjustable
            ((QAdjustable *)&(this->super_QGate1<std::complex<double>_>).field_0xc,fixed);
  (this->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00757e88;
  QAngle<double>::QAngle(&this->angle_,theta);
  return;
}

Assistant:

Phase( const int qubit , const real_type theta ,
               const bool fixed = false )
        : QGate1< T >( qubit )
        , angle_( theta )
        , QAdjustable( fixed )
        { }